

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationFractionalSpacingTests.cpp
# Opt level: O3

TestStatus *
vkt::tessellation::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,SpacingMode spacingMode)

{
  size_type *psVar1;
  void **ppvVar2;
  float fVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp_00;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp_01;
  void *pvVar7;
  bool bVar8;
  LineData *pLVar9;
  pointer pfVar10;
  VkCommandBuffer commandBuffer;
  Allocation *pAVar11;
  float *pfVar12;
  pointer pSVar13;
  deUint32 queueFamilyIndex;
  uint uVar14;
  uint uVar15;
  int iVar16;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar17;
  float *pfVar18;
  DescriptorSetLayoutBuilder *pDVar19;
  DescriptorPoolBuilder *pDVar20;
  DescriptorSetUpdateBuilder *pDVar21;
  const_iterator cVar22;
  GraphicsPipelineBuilder *pGVar23;
  ulong uVar24;
  long *plVar25;
  undefined8 *puVar26;
  pointer __x;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  *p_Var27;
  ulong uVar28;
  pointer pLVar29;
  pointer pfVar30;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  __first;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  long *plVar32;
  pointer pfVar33;
  float *pfVar34;
  int i_1;
  pointer pLVar35;
  int rangeNdx;
  long lVar36;
  pointer pSVar37;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  _Var38;
  undefined1 *__n;
  pointer pLVar39;
  undefined8 uVar40;
  qpTestLog *pqVar41;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  *this;
  vector<float,_std::allocator<float>_> *this_00;
  ulong uVar42;
  ios_base *this_01;
  size_type __n_00;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
  *this_02;
  int *piVar43;
  int i;
  int iVar44;
  VkAccessFlags *pVVar45;
  long lVar46;
  TestStatus *pTVar47;
  pointer pLVar48;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  __last;
  bool bVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  VkDeviceSize VVar55;
  VkDeviceSize bufferSizeBytes;
  undefined4 uVar56;
  vector<float,_std::allocator<float>_> result_1;
  vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  segmentsB;
  int additionalSegmentLocation;
  float additionalSegmentLength;
  vector<float,_std::allocator<float>_> tessLevelCases;
  vector<float,_std::allocator<float>_> sortedCoords;
  vector<float,_std::allocator<float>_> resultTessCoords;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_6e0;
  vector<int,_std::allocator<int>_> additionalSegmentLocations;
  vector<float,_std::allocator<float>_> additionalSegmentLengths;
  VkBufferMemoryBarrier shaderWriteBarrier;
  pointer local_658;
  ios_base local_628 [8];
  ios_base local_620 [132];
  deUint32 local_59c;
  bool local_598;
  VkPrimitiveTopology local_594;
  TestStatus *local_510;
  long local_508;
  long *plStack_500;
  VkAccessFlags local_4f8;
  VkAccessFlags VStack_4f4;
  deUint32 dStack_4f0;
  deUint32 dStack_4ec;
  VkCommandBuffer local_4e8;
  long *plStack_4e0;
  VkAccessFlags local_4d8;
  VkAccessFlags VStack_4d4;
  deUint32 dStack_4d0;
  deUint32 dStack_4cc;
  VkRenderPass local_4c8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_4c0;
  char *local_4a8;
  long local_4a0;
  VkQueue local_498;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_490;
  undefined1 local_488 [8];
  pointer pVStack_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [6];
  ios_base local_410 [264];
  VkPipelineLayout local_308;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_300;
  VkDescriptorSetLayout local_2e8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_2e0;
  Buffer local_2c8;
  VkPipeline local_298;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_290;
  VkCommandPool local_278;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_270;
  VkFramebuffer local_258;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_250;
  VkDescriptorPool local_238;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_230;
  VkDescriptorBufferInfo resultBufferInfo;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  Buffer local_1e0;
  string failNote;
  ios_base local_138 [264];
  
  local_510 = __return_storage_ptr__;
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,9);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_498 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pAVar17 = Context::getDefaultAllocator(context);
  uVar53 = SUB84(pAVar17,0);
  uVar54 = (undefined4)((ulong)pAVar17 >> 0x20);
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar36 = 0;
  do {
    fVar51 = (float)(&tessellation::(anonymous_namespace)::genTessLevelCases()::rangeStarts)[lVar36]
    ;
    iVar44 = 0;
    do {
      fVar50 = (float)iVar44 / 10.0 + fVar51;
      shaderWriteBarrier.sType = (VkStructureType)fVar50;
      if (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&tessLevelCases,
                   (iterator)
                   tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)&shaderWriteBarrier);
      }
      else {
        *tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish = fVar50;
        tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar44 = iVar44 + 1;
    } while (iVar44 != 10);
    lVar36 = lVar36 + 1;
  } while (lVar36 != 3);
  iVar44 = 0;
  do {
    shaderWriteBarrier.sType = (VkStructureType)((float)iVar44 + 0.3);
    if (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&tessLevelCases,
                 (iterator)
                 tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&shaderWriteBarrier);
    }
    else {
      *tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish = (float)iVar44 + 0.3;
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish =
           tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar44 = iVar44 + 1;
  } while (iVar44 != 0x3f);
  pfVar34 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
  pfVar18 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pfVar34 !=
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish &&
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start !=
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fVar51 = *tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      fVar50 = *pfVar34;
      pfVar12 = pfVar34;
      if (*pfVar34 <= fVar51) {
        fVar50 = fVar51;
        pfVar12 = pfVar18;
      }
      pfVar18 = pfVar12;
      fVar51 = fVar50;
      pfVar34 = pfVar34 + 1;
    } while (pfVar34 !=
             tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar44 = getClampedRoundedTessLevel(spacingMode,*pfVar18);
  pAVar17 = (Allocator *)CONCAT44(uVar54,uVar53);
  VVar55 = (long)(iVar44 + 1) * 4 + 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,VVar55,0x20);
  tessellation::Buffer::Buffer
            (&local_2c8,vk,device,pAVar17,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,4,0x20);
  tessellation::Buffer::Buffer
            (&local_1e0,vk,device,pAVar17,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier);
  pDVar19 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,2,(VkSampler *)0x0);
  pDVar19 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar19,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_488,pDVar19,vk,device,0);
  DStack_2e0.m_device = (VkDevice)local_478[0]._0_8_;
  DStack_2e0.m_allocator = (VkAllocationCallbacks *)local_478[0]._8_8_;
  local_2e8.m_internal = (deUint64)local_488;
  DStack_2e0.m_deviceIface = (DeviceInterface *)pVStack_480;
  local_488 = (undefined1  [8])0x0;
  pVStack_480 = (pointer)0x0;
  local_478[0]._M_allocated_capacity = (pointer)0x0;
  local_478[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (shaderWriteBarrier.size != 0) {
    operator_delete((void *)shaderWriteBarrier.size,(long)local_658 - shaderWriteBarrier.size);
  }
  if (shaderWriteBarrier._24_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._24_8_,
                    shaderWriteBarrier.offset - shaderWriteBarrier._24_8_);
  }
  if (shaderWriteBarrier._0_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._0_8_,
                    shaderWriteBarrier._16_8_ - shaderWriteBarrier._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_488);
  pDVar20 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_488,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar20 = ::vk::DescriptorPoolBuilder::addType(pDVar20,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&shaderWriteBarrier,pDVar20,vk,device,1,1);
  DStack_230.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_230.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_238.m_internal = shaderWriteBarrier._0_8_;
  DStack_230.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  if (local_488 != (undefined1  [8])0x0) {
    operator_delete((void *)local_488,local_478[0]._M_allocated_capacity - (long)local_488);
  }
  resultBufferInfo.range = VVar55;
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&shaderWriteBarrier,vk,device,local_238
                    ,local_2e8);
  local_4f8 = shaderWriteBarrier.srcAccessMask;
  VStack_4f4 = shaderWriteBarrier.dstAccessMask;
  dStack_4f0 = shaderWriteBarrier.srcQueueFamilyIndex;
  dStack_4ec = shaderWriteBarrier.dstQueueFamilyIndex;
  local_508 = shaderWriteBarrier._0_8_;
  plStack_500 = (long *)shaderWriteBarrier.pNext;
  resultBufferInfo.buffer.m_internal =
       local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  VVar55 = resultBufferInfo.range;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier);
  pDVar21 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier,(VkStructureType)local_508,
                       (void *)0x0,0);
  pDVar21 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      (pDVar21,(VkStructureType)local_508,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar21,vk,device);
  if (shaderWriteBarrier.size != 0) {
    operator_delete((void *)shaderWriteBarrier.size,(long)local_658 - shaderWriteBarrier.size);
  }
  if (shaderWriteBarrier._24_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._24_8_,
                    shaderWriteBarrier.offset - shaderWriteBarrier._24_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&shaderWriteBarrier);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&shaderWriteBarrier,vk,device);
  DStack_4c0.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_4c0.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_4c8.m_internal = shaderWriteBarrier._0_8_;
  DStack_4c0.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&shaderWriteBarrier,vk,device,
             (VkRenderPass)shaderWriteBarrier._0_8_);
  DStack_250.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_250.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_258.m_internal = shaderWriteBarrier._0_8_;
  DStack_250.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier,vk,device,
                     local_2e8);
  DStack_300.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_300.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_308.m_internal = shaderWriteBarrier._0_8_;
  DStack_300.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier,vk,device,
                  queueFamilyIndex);
  DStack_270.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_270.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_278.m_internal = shaderWriteBarrier._0_8_;
  DStack_270.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier,vk,device,
             (VkCommandPool)shaderWriteBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_4d8 = shaderWriteBarrier.srcAccessMask;
  VStack_4d4 = shaderWriteBarrier.dstAccessMask;
  dStack_4d0 = shaderWriteBarrier.srcQueueFamilyIndex;
  dStack_4cc = shaderWriteBarrier.dstQueueFamilyIndex;
  local_4e8 = (VkCommandBuffer)shaderWriteBarrier._0_8_;
  plStack_4e0 = (long *)shaderWriteBarrier.pNext;
  memset(&shaderWriteBarrier,0,0xfc);
  local_59c = 1;
  local_598 = false;
  local_594 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  failNote._M_dataplus._M_p = (pointer)&failNote.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&failNote,"vert","");
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&failNote);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&shaderWriteBarrier,vk,device,
                       VK_SHADER_STAGE_VERTEX_BIT,*(ProgramBinary **)(cVar22._M_node + 2),
                       (VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result_1,"tesc","");
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&result_1);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      (pGVar23,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar22._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  segmentsB.
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&segmentsB.
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&segmentsB,"tese","");
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&segmentsB);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      (pGVar23,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar22._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_488,pGVar23,vk,device,local_308,
             local_4c8);
  DStack_290.m_device = (VkDevice)local_478[0]._0_8_;
  DStack_290.m_allocator = (VkAllocationCallbacks *)local_478[0]._8_8_;
  local_298.m_internal = (deUint64)local_488;
  DStack_290.m_deviceIface = (DeviceInterface *)pVStack_480;
  local_488 = (undefined1  [8])0x0;
  pVStack_480 = (pointer)0x0;
  local_478[0]._M_allocated_capacity = (qpTestLog *)0x0;
  local_478[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (segmentsB.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&segmentsB.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(segmentsB.
                                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->index + 1))
    ;
  }
  if ((pointer *)
      result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)failNote._M_dataplus._M_p != &failNote.field_2) {
    operator_delete(failNote._M_dataplus._M_p,failNote.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&shaderWriteBarrier);
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_4a8 = "odd";
    if (spacingMode == SPACINGMODE_FRACTIONAL_EVEN) {
      local_4a8 = "even";
    }
    local_4a0 = (ulong)(spacingMode == SPACINGMODE_FRACTIONAL_EVEN) + 3;
    uVar42 = 0;
    do {
      pVVar45 = &shaderWriteBarrier.srcAccessMask;
      *(float *)(local_1e0.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
                m_hostPtr =
           tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar42];
      ::vk::flushMappedMemoryRange
                (vk,device,
                 (VkDeviceMemory)
                 ((local_1e0.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (local_1e0.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,4);
      pAVar11 = local_2c8.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      bufferSizeBytes = VVar55;
      memset((local_2c8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr,0,VVar55);
      ::vk::flushMappedMemoryRange
                (vk,device,(VkDeviceMemory)(pAVar11->m_memory).m_internal,pAVar11->m_offset,VVar55);
      commandBuffer = local_4e8;
      beginCommandBuffer(vk,local_4e8);
      beginRenderPassWithRasterizationDisabled(vk,commandBuffer,local_4c8,local_258);
      (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,local_298.m_internal);
      (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,0,local_308.m_internal,0,1,&local_508,0,0)
      ;
      (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,1,1,0,0);
      endRenderPass(vk,commandBuffer);
      makeBufferMemoryBarrier
                (&shaderWriteBarrier,0x40,0x2000,
                 (VkBuffer)
                 local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0,bufferSizeBytes);
      iVar44 = 0;
      (*vk->_vptr_DeviceInterface[0x6d])
                (vk,commandBuffer,0x8000,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
      endCommandBuffer(vk,commandBuffer);
      submitCommandsAndWait(vk,device,local_498,commandBuffer);
      pAVar11 = local_2c8.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)context->m_testCtx->m_log;
      ::vk::invalidateMappedMemoryRange
                (vk,device,
                 (VkDeviceMemory)
                 ((local_2c8.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (local_2c8.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,bufferSizeBytes);
      piVar43 = (int *)pAVar11->m_hostPtr;
      __n_00 = (size_type)*piVar43;
      std::vector<float,_std::allocator<float>_>::vector
                (&resultTessCoords,__n_00,(allocator_type *)&shaderWriteBarrier);
      memcpy(resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,piVar43 + 1,__n_00 << 2);
      fVar51 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar42];
      fVar50 = getClampedTessLevel(spacingMode,fVar51);
      uVar14 = getRoundedTessLevel(spacingMode,fVar50);
      std::vector<float,_std::allocator<float>_>::vector(&sortedCoords,&resultTessCoords);
      pfVar33 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pfVar30 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start !=
          sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar24 = (long)sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar36 = 0x3f;
        if (uVar24 != 0) {
          for (; uVar24 >> lVar36 == 0; lVar36 = lVar36 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar36 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pfVar30,pfVar33);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier);
      std::ostream::_M_insert<double>((double)fVar51);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier);
      std::ios_base::~ios_base(local_628);
      plVar25 = (long *)std::__cxx11::string::replace((ulong)&segmentsB,0,(char *)0x0,0xb492b7);
      result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      pfVar30 = (pointer)(plVar25 + 2);
      if ((pointer)*plVar25 == pfVar30) {
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pfVar30;
      }
      else {
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pfVar30;
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar25;
      }
      result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar25[1];
      *plVar25 = (long)pfVar30;
      plVar25[1] = 0;
      *(undefined1 *)(plVar25 + 2) = 0;
      plVar25 = (long *)std::__cxx11::string::append((char *)&result_1);
      local_488 = (undefined1  [8])local_478;
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar25 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar25 == paVar31) {
        local_478[0]._0_8_ = paVar31->_M_allocated_capacity;
        local_478[0]._8_8_ = plVar25[3];
      }
      else {
        local_478[0]._0_8_ = paVar31->_M_allocated_capacity;
        local_488 = (undefined1  [8])*plVar25;
      }
      pVStack_480 = (pointer)plVar25[1];
      *plVar25 = (long)paVar31;
      plVar25[1] = 0;
      *(undefined1 *)(plVar25 + 2) = 0;
      local_6e0._M_current =
           sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_490._M_current =
           sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                ((string *)&shaderWriteBarrier,(tessellation *)&local_6e0,&local_490,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 0x0,0,iVar44);
      uVar40 = (qpTestLog *)0xf;
      if (local_488 != (undefined1  [8])local_478) {
        uVar40 = local_478[0]._M_allocated_capacity;
      }
      if ((ulong)uVar40 < (qpTestLog *)((long)shaderWriteBarrier.pNext + (long)pVStack_480)) {
        pqVar41 = (qpTestLog *)0xf;
        if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != pVVar45) {
          pqVar41 = (qpTestLog *)shaderWriteBarrier._16_8_;
        }
        if (pqVar41 < (qpTestLog *)((long)shaderWriteBarrier.pNext + (long)pVStack_480))
        goto LAB_0078cd26;
        puVar26 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&shaderWriteBarrier,0,(char *)0x0,(ulong)local_488);
      }
      else {
LAB_0078cd26:
        puVar26 = (undefined8 *)std::__cxx11::string::_M_append(local_488,shaderWriteBarrier._0_8_);
      }
      failNote._M_dataplus._M_p = (pointer)&failNote.field_2;
      psVar1 = puVar26 + 2;
      if ((size_type *)*puVar26 == psVar1) {
        failNote.field_2._M_allocated_capacity = *psVar1;
        failNote.field_2._8_8_ = puVar26[3];
      }
      else {
        failNote.field_2._M_allocated_capacity = *psVar1;
        failNote._M_dataplus._M_p = (pointer)*puVar26;
      }
      failNote._M_string_length = puVar26[1];
      *puVar26 = psVar1;
      puVar26[1] = 0;
      *(char *)psVar1 = '\0';
      __n = (undefined1 *)failNote._M_string_length;
      if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != pVVar45) {
        __n = (undefined1 *)(shaderWriteBarrier._16_8_ + 1);
        operator_delete((void *)shaderWriteBarrier._0_8_,(ulong)__n);
      }
      if (local_488 != (undefined1  [8])local_478) {
        __n = (undefined1 *)(local_478[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_488,(ulong)__n);
      }
      if ((pointer *)
          result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          &result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        __n = (undefined1 *)
              ((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1);
        operator_delete(result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)__n);
      }
      if (segmentsB.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = (undefined1 *)
              ((long)&(segmentsB.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->index + 1);
        operator_delete(segmentsB.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__n);
      }
      if (uVar14 + 1 ==
          (int)((ulong)((long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2)) {
        if ((((*sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != 0.0) ||
             (NAN(*sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start))) ||
            (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] != 1.0)) ||
           (NAN(sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]))) {
          local_488 = (undefined1  [8])paVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
          ppvVar2 = &shaderWriteBarrier.pNext;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,
                     "Failure: smallest coordinate should be 0.0 and biggest should be 1.0",0x44);
          shaderWriteBarrier._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar2,failNote._M_dataplus._M_p,failNote._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
          std::ios_base::~ios_base(local_620);
          goto LAB_0078d09e;
        }
        if ((int)uVar14 < 0) {
          std::__throw_length_error("cannot create std::vector larger than max_size()");
        }
        this = (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                *)(long)(int)uVar14;
        __x = std::
              _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ::_M_allocate(this,(size_t)__n);
        p_Var27 = this;
        pSVar37 = __x;
        if (uVar14 != 0) {
          do {
            pSVar37->index = -1;
            pSVar37->length = -1.0;
            pSVar37 = pSVar37 + 1;
            p_Var27 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                       *)((long)&p_Var27[-1]._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          } while (p_Var27 !=
                   (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    *)0x0);
          uVar24 = 0;
          do {
            fVar51 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar24 + 1];
            fVar52 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar24];
            __x[uVar24].index = (int)uVar24;
            __x[uVar24].length = fVar51 - fVar52;
            uVar24 = uVar24 + 1;
          } while (uVar14 != uVar24);
        }
        uVar24 = (long)pSVar37 - (long)__x;
        std::vector<float,_std::allocator<float>_>::vector
                  (&result_1,(long)uVar24 >> 3,(allocator_type *)&segmentsB);
        uVar15 = (uint)(uVar24 >> 3);
        if (0 < (int)uVar15) {
          uVar28 = 0;
          do {
            result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar28] = __x[uVar28].length;
            uVar28 = uVar28 + 1;
          } while ((uVar15 & 0x7fffffff) != uVar28);
        }
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_6e0._M_current =
             result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                  ((string *)local_488,(tessellation *)&segmentsB,&local_6e0,
                   (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   0x0,0,iVar44);
        plVar25 = (long *)std::__cxx11::string::replace((ulong)local_488,0,(char *)0x0,0xb49406);
        plVar32 = plVar25 + 2;
        if ((long *)*plVar25 == plVar32) {
          shaderWriteBarrier._16_8_ = *plVar32;
          shaderWriteBarrier._24_8_ = plVar25[3];
          shaderWriteBarrier._0_8_ = pVVar45;
        }
        else {
          shaderWriteBarrier._16_8_ = *plVar32;
          shaderWriteBarrier._0_8_ = (long *)*plVar25;
        }
        shaderWriteBarrier.pNext = (void *)plVar25[1];
        *plVar25 = (long)plVar32;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&failNote,shaderWriteBarrier._0_8_);
        if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != pVVar45) {
          operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
        }
        if (local_488 != (undefined1  [8])local_478) {
          operator_delete((void *)local_488,(ulong)(local_478[0]._M_allocated_capacity + 1));
        }
        if (result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ::push_back((vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                     *)&result_1,__x);
        uVar15 = (uint)((long)uVar24 >> 3);
        if (1 < (int)uVar15) {
          lVar36 = (ulong)(uVar15 & 0x7fffffff) - 1;
          pSVar37 = __x;
          do {
            pfVar30 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            fVar52 = pSVar37[1].length -
                     result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[1];
            fVar51 = -fVar52;
            if (-fVar52 <= fVar52) {
              fVar51 = fVar52;
            }
            this_00 = &result_1;
            if ((0.001 <= fVar51) &&
               (this_00 = (vector<float,_std::allocator<float>_> *)&segmentsB,
               segmentsB.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               segmentsB.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
              fVar52 = pSVar37[1].length -
                       (segmentsB.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start)->length;
              fVar51 = -fVar52;
              if (-fVar52 <= fVar52) {
                fVar51 = fVar52;
              }
              if (0.001 <= fVar51) {
                fVar50 = SUB84(segmentsB.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                               ._M_impl.super__Vector_impl_data._M_start,0);
                uVar54 = (undefined4)
                         ((ulong)segmentsB.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 0x20);
                local_488 = (undefined1  [8])paVar5;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pVStack_480,
                           "Failure: couldn\'t divide segments to 2 groups by length; ",0x39);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pVStack_480,"e.g. segment of length ",0x17);
                std::ostream::_M_insert<double>((double)pSVar37[1].length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pVStack_480," isn\'t approximately equal to either ",0x25);
                std::ostream::_M_insert<double>((double)pfVar30[1]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," or ",4)
                ;
                std::ostream::_M_insert<double>((double)*(float *)(CONCAT44(uVar54,fVar50) + 4));
                shaderWriteBarrier._0_8_ =
                     tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_488,
                                (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream
                          ((ostringstream *)&shaderWriteBarrier.pNext);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                           failNote._M_string_length);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&shaderWriteBarrier,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                goto LAB_0078d7b9;
              }
            }
            std::
            vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ::push_back((vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                         *)this_00,pSVar37 + 1);
            lVar36 = lVar36 + -1;
            pSVar37 = pSVar37 + 1;
          } while (lVar36 != 0);
        }
        pSVar37 = segmentsB.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pfVar10 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        pfVar33 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar30 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start ==
             result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish || fVar50 != (float)(int)uVar14) ||
           (segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          if ((result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start ==
               result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish) ||
             (segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            additionalSegmentLength = -1.0;
            if (uVar24 != 8) {
              additionalSegmentLength = __x->length;
            }
            additionalSegmentLocation = -1;
            bVar49 = true;
            goto LAB_0078d69e;
          }
          if (((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start != 0x10) &&
             ((long)segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x10)) {
            local_488 = (undefined1  [8])paVar5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_480,
                       "Failure: when dividing the segments to 2 groups by length, neither of the two groups has exactly 2 or 0 segments in it"
                       ,0x76);
            shaderWriteBarrier._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                       failNote._M_string_length);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&shaderWriteBarrier,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0078d630;
          }
          if ((long)segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x10) {
            result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)segmentsB.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)segmentsB.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)segmentsB.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar30;
            segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)pfVar33;
            segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar10;
          }
          pfVar30 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pSVar37 = (pointer)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start;
          pSVar13 = (pointer)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish;
          if ((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x10) {
            if (result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[1] <
                (segmentsB.
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length) {
              result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)segmentsB.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar30;
              pSVar37 = segmentsB.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar13 = segmentsB.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish;
            }
LAB_0078d945:
            result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)pSVar13;
            result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pSVar37;
            iVar44 = (segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->index;
            iVar16 = segmentsB.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].index;
            if (iVar44 + iVar16 + 1U != uVar15) {
              fVar50 = SUB84(segmentsB.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                             ._M_impl.super__Vector_impl_data._M_start,0);
              uVar54 = (undefined4)
                       ((ulong)segmentsB.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
              local_488 = (undefined1  [8])paVar5;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pVStack_480,
                         "Failure: the two additional segments aren\'t placed symmetrically; ",0x42)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pVStack_480,"one is at index ",0x10);
              std::ostream::operator<<
                        ((ostringstream *)&pVStack_480,*(int *)CONCAT44(uVar54,fVar50));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pVStack_480," and other is at index ",0x17);
              std::ostream::operator<<
                        ((ostringstream *)&pVStack_480,*(int *)(CONCAT44(uVar54,fVar50) + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pVStack_480," (note: the two indexes should sum to ",0x26);
              std::ostream::operator<<((ostringstream *)&pVStack_480,uVar15 - 1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pVStack_480,", i.e. numberOfSegments-1)",0x1a);
              shaderWriteBarrier._0_8_ =
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_488,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                         failNote._M_string_length);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&shaderWriteBarrier,
                         (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream
                        ((ostringstream *)&shaderWriteBarrier.pNext);
              std::ios_base::~ios_base(local_620);
              goto LAB_0078dac7;
            }
            additionalSegmentLength =
                 (segmentsB.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start)->length;
            if ((((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start != 0x10) ||
                (additionalSegmentLocation = -1,
                additionalSegmentLength <
                result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[1] + -0.001)) &&
               (additionalSegmentLocation = iVar16, iVar44 < iVar16)) {
              additionalSegmentLocation = iVar44;
            }
            bVar49 = true;
            pSVar37 = segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            if ((segmentsB.
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->length <=
                result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[1] + 0.001) goto LAB_0078d945;
            fVar50 = SUB84(segmentsB.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                           ._M_impl.super__Vector_impl_data._M_start,0);
            uVar54 = (undefined4)
                     ((ulong)segmentsB.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x20);
            local_488 = (undefined1  [8])paVar5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_480,
                       "Failure: the two additional segments are longer than the other segments",
                       0x47);
            shaderWriteBarrier._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                       failNote._M_string_length);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&shaderWriteBarrier,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0078d7b9:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
            std::ios_base::~ios_base(local_620);
LAB_0078dac7:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
            std::ios_base::~ios_base(local_410);
            bVar49 = false;
            pSVar37 = (pointer)CONCAT44(uVar54,fVar50);
          }
LAB_0078dae2:
          operator_delete(pSVar37,(long)segmentsB.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pSVar37);
          pfVar30 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          local_488 = (undefined1  [8])paVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_480,
                     "Failure: clamped and final tessellation level are equal, but not all segments are of equal length."
                     ,0x62);
          shaderWriteBarrier._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                     failNote._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0078d630:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::ios_base::~ios_base(local_620);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
          std::ios_base::~ios_base(local_410);
          bVar49 = false;
LAB_0078d69e:
          if (pSVar37 != (pointer)0x0) goto LAB_0078dae2;
        }
        if (pfVar30 != (pointer)0x0) {
          operator_delete(pfVar30,(long)result_1.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pfVar30);
        }
        operator_delete(__x,(long)this << 3);
      }
      else {
        local_488 = (undefined1  [8])paVar5;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,"Failure: number of vertices is ",0x1f);
        std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_480);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,"; expected ",0xb);
        std::ostream::operator<<((ostringstream *)&pVStack_480,uVar14 + 1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480," (clamped tessellation level is ",0x20);
        std::ostream::_M_insert<double>((double)fVar50);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,")",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,"; final level (clamped level rounded up to ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,local_4a8,local_4a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,") is ",5);
        std::ostream::operator<<((ostringstream *)&pVStack_480,uVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,
                   " and should equal the number of segments, i.e. number of vertices minus 1",0x49)
        ;
        shaderWriteBarrier._0_8_ =
             tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                   failNote._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
        std::ios_base::~ios_base(local_620);
LAB_0078d09e:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
        std::ios_base::~ios_base(local_410);
        bVar49 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)failNote._M_dataplus._M_p != &failNote.field_2) {
        operator_delete(failNote._M_dataplus._M_p,failNote.field_2._M_allocated_capacity + 1);
      }
      if (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (!bVar49) {
        if (resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_0078e3db;
      }
      if (additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&additionalSegmentLengths,
                   (iterator)
                   additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&additionalSegmentLength);
      }
      else {
        *additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish = additionalSegmentLength;
        additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&additionalSegmentLocations,
                   (iterator)
                   additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&additionalSegmentLocation);
      }
      else {
        *additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = additionalSegmentLocation;
        additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      VVar55 = bufferSizeBytes;
      if (resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar42 = (ulong)((int)uVar42 + 1);
    } while (uVar42 < (ulong)((long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2));
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)context->m_testCtx->m_log;
    if ((int)((ulong)((long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < 1) {
      pLVar39 = (pointer)0x0;
      pLVar35 = (pointer)0x0;
      uVar53 = 0;
      uVar56 = 0;
    }
    else {
      lVar36 = 0;
      pLVar48 = (pointer)0x0;
      pLVar35 = (pointer)0x0;
      pLVar39 = (pointer)0x0;
      pfVar30 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar33 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      fVar51 = fVar50;
      do {
        fVar52 = pfVar30[lVar36];
        fVar50 = additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar36];
        iVar44 = additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar36];
        if (pLVar35 == pLVar39) {
          uVar42 = (long)pLVar35 - (long)pLVar48;
          if (uVar42 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar28 = ((long)uVar42 >> 2) * -0x5555555555555555;
          uVar24 = uVar28;
          if (pLVar35 == pLVar48) {
            uVar24 = 1;
          }
          this_02 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                     *)(uVar24 + uVar28);
          if ((_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
               *)0xaaaaaaaaaaaaaa9 < this_02) {
            this_02 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                       *)0xaaaaaaaaaaaaaaa;
          }
          if (CARRY8(uVar24,uVar28)) {
            this_02 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                       *)0xaaaaaaaaaaaaaaa;
          }
          pLVar29 = std::
                    _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                    ::_M_allocate(this_02,(size_t)pLVar39);
          *(float *)((long)pLVar29 + uVar42) = fVar52;
          *(float *)((long)pLVar29 + uVar42 + 4) = fVar50;
          *(int *)((long)pLVar29 + uVar42 + 8) = iVar44;
          uVar53 = SUB84(pLVar29,0);
          uVar56 = (undefined4)((ulong)pLVar29 >> 0x20);
          for (pLVar39 = pLVar48; pLVar35 != pLVar39; pLVar39 = pLVar39 + 1) {
            pLVar29->additionalSegmentLocation = pLVar39->additionalSegmentLocation;
            fVar51 = pLVar39->additionalSegmentLength;
            pLVar29->tessLevel = pLVar39->tessLevel;
            pLVar29->additionalSegmentLength = fVar51;
            pLVar29 = pLVar29 + 1;
          }
          if (pLVar48 != (pointer)0x0) {
            operator_delete(pLVar48,uVar42);
          }
          pLVar48 = (pointer)CONCAT44(uVar56,uVar53);
          pLVar39 = pLVar48 + (long)this_02;
          pfVar30 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pfVar33 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          pLVar35->tessLevel = fVar52;
          pLVar35->additionalSegmentLength = fVar50;
          pLVar35->additionalSegmentLocation = iVar44;
          uVar53 = SUB84(pLVar48,0);
          uVar56 = (undefined4)((ulong)pLVar48 >> 0x20);
          pLVar29 = pLVar35;
          fVar50 = fVar51;
        }
        pLVar35 = pLVar29 + 1;
        lVar36 = lVar36 + 1;
        fVar51 = fVar50;
      } while (lVar36 < (int)((ulong)((long)pfVar33 - (long)pfVar30) >> 2));
    }
    pLVar48 = (pointer)CONCAT44(uVar56,uVar53);
    uVar42 = (long)pLVar35 - (long)pLVar48;
    __first._M_current =
         std::
         _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
         ::_M_allocate((_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                        *)(((long)uVar42 >> 2) * -0x5555555555555555),(size_t)pLVar39);
    __last._M_current = __first._M_current;
    if (pLVar48 != pLVar35) {
      lVar36 = 0;
      do {
        lVar46 = lVar36;
        puVar26 = (undefined8 *)(CONCAT44(uVar56,uVar53) + lVar46);
        *(undefined4 *)((long)&(__first._M_current)->additionalSegmentLocation + lVar46) =
             *(undefined4 *)(puVar26 + 1);
        *(undefined8 *)((long)&(__first._M_current)->tessLevel + lVar46) = *puVar26;
        lVar36 = lVar46 + 0xc;
      } while ((pointer)((long)puVar26 + 0xc) != pLVar35);
      if (lVar36 != 0) {
        __last._M_current = (LineData *)((long)&__first._M_current[1].tessLevel + lVar46);
        uVar24 = (lVar36 >> 2) * -0x5555555555555555;
        lVar6 = 0x3f;
        if (uVar24 != 0) {
          for (; uVar24 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        __comp._M_comp.m_membP._4_4_ = uVar54;
        __comp._M_comp.m_membP._0_4_ = fVar50;
        __comp._M_comp._8_4_ = uVar53;
        __comp._M_comp._12_4_ = uVar56;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                  (__first,__last,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,__comp);
        if (lVar36 < 0xc1) {
          __comp_01._M_comp.m_membP._4_4_ = uVar54;
          __comp_01._M_comp.m_membP._0_4_ = fVar50;
          __comp_01._M_comp._8_4_ = uVar53;
          __comp_01._M_comp._12_4_ = uVar56;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                    (__first,__last,__comp_01);
        }
        else {
          __comp_00._M_comp.m_membP._4_4_ = uVar54;
          __comp_00._M_comp.m_membP._0_4_ = fVar50;
          __comp_00._M_comp._8_4_ = uVar53;
          __comp_00._M_comp._12_4_ = uVar56;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                    (__first,__first._M_current + 0x10,__comp_00);
          if (lVar36 != 0xc0) {
            _Var38._M_current = __first._M_current + 0x10;
            do {
              fVar51 = (_Var38._M_current)->tessLevel;
              fVar52 = (_Var38._M_current)->additionalSegmentLength;
              iVar44 = (_Var38._M_current)->additionalSegmentLocation;
              fVar50 = _Var38._M_current[-1].tessLevel;
              pLVar9 = _Var38._M_current;
              while (fVar51 < fVar50) {
                pLVar9->additionalSegmentLocation = pLVar9[-1].additionalSegmentLocation;
                fVar50 = pLVar9[-1].additionalSegmentLength;
                pLVar9->tessLevel = pLVar9[-1].tessLevel;
                pLVar9->additionalSegmentLength = fVar50;
                fVar50 = pLVar9[-2].tessLevel;
                pLVar9 = pLVar9 + -1;
              }
              pLVar9->tessLevel = fVar51;
              pLVar9->additionalSegmentLength = fVar52;
              pLVar9->additionalSegmentLocation = iVar44;
              bVar49 = (LineData *)((long)&(__first._M_current)->tessLevel + lVar46) !=
                       _Var38._M_current;
              _Var38._M_current = _Var38._M_current + 1;
            } while (bVar49);
          }
        }
      }
    }
    uVar14 = (int)((long)__last._M_current - (long)__first._M_current >> 2) * -0x55555555;
    if (1 < (int)uVar14) {
      uVar24 = (ulong)(uVar14 & 0x7fffffff);
      lVar36 = uVar24 - 1;
      piVar43 = &__first._M_current[1].additionalSegmentLocation;
      do {
        if ((-1 < *piVar43) && (-1 < piVar43[-3])) {
          fVar51 = getClampedTessLevel(spacingMode,((LineData *)(piVar43 + -2))->tessLevel);
          fVar50 = getClampedTessLevel(spacingMode,(float)piVar43[-5]);
          if ((fVar51 == fVar50) && ((!NAN(fVar51) && !NAN(fVar50) && (*piVar43 != piVar43[-3])))) {
            local_488 = (undefined1  [8])paVar5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_480,
                       "Failure: additional segments not located identically for two edges with identical clamped tessellation levels"
                       ,0x6d);
            shaderWriteBarrier._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            ppvVar2 = &shaderWriteBarrier.pNext;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppvVar2,"Note: tessellation levels are ",0x1e);
            std::ostream::_M_insert<double>((double)((LineData *)(piVar43 + -2))->tessLevel);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
            std::ostream::_M_insert<double>((double)(float)piVar43[-5]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppvVar2," (clamped level ",0x10);
            fVar51 = getClampedTessLevel(spacingMode,((LineData *)(piVar43 + -2))->tessLevel);
            std::ostream::_M_insert<double>((double)fVar51);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppvVar2,"; but first additional segments located at indices ",0x33
                      );
            std::ostream::operator<<(ppvVar2,*piVar43);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
            std::ostream::operator<<(ppvVar2,piVar43[-3]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppvVar2,", respectively",0xe);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&shaderWriteBarrier,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
            std::ios_base::~ios_base(local_620);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
            this_01 = local_410;
            goto LAB_0078e341;
          }
        }
        piVar43 = piVar43 + 3;
        lVar36 = lVar36 + -1;
      } while (lVar36 != 0);
      lVar36 = uVar24 - 1;
      pfVar34 = &__first._M_current[1].additionalSegmentLength;
LAB_0078de87:
      if ((*pfVar34 <= 0.0 && *pfVar34 != 0.0) || (pfVar34[-3] <= 0.0 && pfVar34[-3] != 0.0))
      goto LAB_0078df0e;
      fVar51 = getClampedTessLevel(spacingMode,((LineData *)(pfVar34 + -1))->tessLevel);
      fVar50 = getClampedTessLevel(spacingMode,pfVar34[-4]);
      iVar44 = getRoundedTessLevel(spacingMode,fVar51);
      iVar16 = getRoundedTessLevel(spacingMode,fVar50);
      if (iVar44 != iVar16) goto LAB_0078df0e;
      fVar52 = pfVar34[-3];
      fVar3 = *pfVar34;
      if (fVar52 <= fVar3) {
        if ((fVar51 == fVar50) && (!NAN(fVar51) && !NAN(fVar50))) {
          if ((fVar3 != fVar52) || (NAN(fVar3) || NAN(fVar52))) goto LAB_0078e0c2;
        }
        goto LAB_0078df0e;
      }
LAB_0078e0c2:
      psVar1 = &failNote._M_string_length;
      failNote._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)psVar1,
                 "Failure: additional segment length isn\'t monotonically decreasing with the fraction <n> - <f>, among edges with same final tessellation level"
                 ,0x8d);
      local_488 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&failNote,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pVStack_480,
                 "Note: <f> stands for the clamped tessellation level and <n> for the final (rounded and clamped) tessellation level"
                 ,0x72);
      shaderWriteBarrier._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
      ppvVar2 = &shaderWriteBarrier.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar2,"Note: two edges have tessellation levels ",0x29);
      std::ostream::_M_insert<double>((double)pfVar34[-4]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
      std::ostream::_M_insert<double>((double)((LineData *)(pfVar34 + -1))->tessLevel);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," respectively",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,", clamped ",10);
      std::ostream::_M_insert<double>((double)fVar50);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
      std::ostream::_M_insert<double>((double)fVar51);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,", final ",8);
      std::ostream::operator<<(ppvVar2,iVar44);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
      std::ostream::operator<<(ppvVar2,iVar44);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,"; fractions are ",0x10)
      ;
      std::ostream::_M_insert<double>((double)((float)iVar44 - fVar50));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
      std::ostream::_M_insert<double>((double)((float)iVar44 - fVar51));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar2,", but resulted in segment lengths ",0x22);
      std::ostream::_M_insert<double>((double)pfVar34[-3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
      std::ostream::_M_insert<double>((double)*pfVar34);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
      std::ios_base::~ios_base(local_620);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
      std::ios_base::~ios_base(local_410);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
      this_01 = local_138;
LAB_0078e341:
      std::ios_base::~ios_base(this_01);
      bVar49 = false;
      goto LAB_0078e348;
    }
    bVar8 = true;
    bVar49 = true;
    if (__first._M_current != (LineData *)0x0) goto LAB_0078e348;
    goto LAB_0078e355;
  }
LAB_0078e3db:
  shaderWriteBarrier._0_8_ = &shaderWriteBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>((string *)&shaderWriteBarrier,"Failure","");
  pTVar47 = local_510;
  local_510->m_code = QP_TEST_RESULT_FAIL;
  (local_510->m_description)._M_dataplus._M_p = (pointer)&(local_510->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_510->m_description,shaderWriteBarrier._0_8_,
             (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  if ((VkAccessFlags *)shaderWriteBarrier._0_8_ == &shaderWriteBarrier.srcAccessMask)
  goto LAB_0078e452;
LAB_0078e442:
  operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
LAB_0078e452:
  if (additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_290,local_298);
  }
  if (local_4e8 != (VkCommandBuffer)0x0) {
    shaderWriteBarrier._0_8_ = local_4e8;
    (**(code **)(*plStack_4e0 + 0x240))(plStack_4e0,_local_4d8,_dStack_4d0,1);
  }
  if (local_278.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_270,local_278);
  }
  if (local_308.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_300,local_308);
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_250,local_258);
  }
  if (local_4c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_4c0,local_4c8);
  }
  if (local_508 != 0) {
    shaderWriteBarrier._0_8_ = local_508;
    (**(code **)(*plStack_500 + 0x1e8))(plStack_500,_local_4f8,_dStack_4f0,1);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_230,local_238);
  }
  if (local_2e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_2e0,local_2e8);
  }
  if (local_1e0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_1e0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_1e0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_1e0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_1e0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_1e0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pTVar47;
LAB_0078df0e:
  pfVar34 = pfVar34 + 3;
  lVar36 = lVar36 + -1;
  if (lVar36 == 0) goto code_r0x0078df1b;
  goto LAB_0078de87;
code_r0x0078df1b:
  bVar49 = true;
LAB_0078e348:
  bVar8 = bVar49;
  operator_delete(__first._M_current,uVar42);
LAB_0078e355:
  pvVar7 = (void *)CONCAT44(uVar56,uVar53);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)pLVar39 - (long)pvVar7);
  }
  if (!bVar8) goto LAB_0078e3db;
  shaderWriteBarrier._0_8_ = &shaderWriteBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>((string *)&shaderWriteBarrier,"OK","");
  pTVar47 = local_510;
  local_510->m_code = QP_TEST_RESULT_PASS;
  (local_510->m_description)._M_dataplus._M_p = (pointer)&(local_510->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_510->m_description,shaderWriteBarrier._0_8_,
             (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  if ((VkAccessFlags *)shaderWriteBarrier._0_8_ == &shaderWriteBarrier.srcAccessMask)
  goto LAB_0078e452;
  goto LAB_0078e442;
}

Assistant:

tcu::TestStatus test (Context& context, const SpacingMode spacingMode)
{
	DE_ASSERT(spacingMode == SPACINGMODE_FRACTIONAL_ODD || spacingMode == SPACINGMODE_FRACTIONAL_EVEN);

	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const std::vector<float>	tessLevelCases = genTessLevelCases();
	const int					maxNumVertices = 1 + getClampedRoundedTessLevel(spacingMode, *std::max_element(tessLevelCases.begin(), tessLevelCases.end()));

	// Result buffer: generated tess coords go here.

	const VkDeviceSize resultBufferSizeBytes = sizeof(int) + sizeof(float) * maxNumVertices;
	const Buffer	   resultBuffer			 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Outer1 tessellation level constant buffer.

	const VkDeviceSize tessLevelsBufferSizeBytes = sizeof(float);  // we pass only outer1
	const Buffer	   tessLevelsBuffer			 (vk, device, allocator, makeBufferCreateInfo(tessLevelsBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet			(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  tessLevelsBufferInfo	= makeDescriptorBufferInfo(tessLevelsBuffer.get(), 0ull, tessLevelsBufferSizeBytes);
	const VkDescriptorBufferInfo  resultBufferInfo		= makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkRenderPass>		renderPass	  (makeRenderPassWithoutAttachments	(vk, device));
	const Unique<VkFramebuffer>		framebuffer	  (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout				(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool		  (makeCommandPool					(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer	  (allocateCommandBuffer			(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL)
		.build(vk, device, *pipelineLayout, *renderPass));

	// Data that will be verified across all cases
	std::vector<float> additionalSegmentLengths;
	std::vector<int>   additionalSegmentLocations;

	bool success = false;

	// Repeat the test for all tessellation coords cases
	for (deUint32 tessLevelCaseNdx = 0; tessLevelCaseNdx < tessLevelCases.size(); ++tessLevelCaseNdx)
	{
		// Upload tessellation levels data to the input buffer
		{
			const Allocation& alloc			  = tessLevelsBuffer.getAllocation();
			float* const	  tessLevelOuter1 = static_cast<float*>(alloc.getHostPtr());

			*tessLevelOuter1 = tessLevelCases[tessLevelCaseNdx];
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), tessLevelsBufferSizeBytes);
		}

		// Clear the results buffer
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		beginCommandBuffer(vk, *cmdBuffer);

		// Begin render pass
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify the result.
		{
			tcu::TestLog& log = context.getTestContext().getLog();

			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32 numResults = *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<float> resultTessCoords = readFloatArray(numResults, resultAlloc.getHostPtr(), sizeof(deInt32));

			// Outputs
			float additionalSegmentLength;
			int   additionalSegmentLocation;

			success = verifyFractionalSpacingSingle(log, spacingMode, tessLevelCases[tessLevelCaseNdx], resultTessCoords,
													&additionalSegmentLength, &additionalSegmentLocation);

			if (!success)
				break;

			additionalSegmentLengths.push_back(additionalSegmentLength);
			additionalSegmentLocations.push_back(additionalSegmentLocation);
		}
	} // for tessLevelCaseNdx

	if (success)
		success = verifyFractionalSpacingMultiple(context.getTestContext().getLog(), spacingMode, tessLevelCases, additionalSegmentLengths, additionalSegmentLocations);

	return (success ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Failure"));
}